

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

int side1_7d_filter(double *p0,double *p1,double *q0)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  dVar15 = p0[2];
  dVar21 = dVar15 - p1[2];
  dVar22 = p0[3];
  dVar19 = dVar22 - p1[3];
  dVar1 = p0[4];
  dVar18 = dVar1 - p1[4];
  dVar2 = p0[5];
  dVar23 = p1[2] - dVar15;
  dVar3 = *p0;
  dVar4 = p0[1];
  dVar24 = dVar3 - *p1;
  dVar25 = dVar4 - p1[1];
  dVar14 = ABS(dVar25);
  if (ABS(dVar25) <= ABS(dVar24)) {
    dVar14 = ABS(dVar24);
  }
  dVar6 = ABS(dVar21);
  if (ABS(dVar21) <= dVar14) {
    dVar6 = dVar14;
  }
  dVar14 = ABS(dVar19);
  if (ABS(dVar19) <= dVar6) {
    dVar14 = dVar6;
  }
  dVar6 = ABS(dVar18);
  if (ABS(dVar18) <= dVar14) {
    dVar6 = dVar14;
  }
  dVar27 = dVar2 - p1[5];
  dVar14 = ABS(dVar27);
  if (ABS(dVar27) <= dVar6) {
    dVar14 = dVar6;
  }
  dVar6 = p0[6];
  dVar7 = dVar6 - p1[6];
  dVar8 = ABS(dVar7);
  if (ABS(dVar7) <= dVar14) {
    dVar8 = dVar14;
  }
  dVar20 = *p1 - dVar3;
  auVar33._0_8_ = ABS(*q0 - dVar3);
  auVar33._8_8_ = ABS(dVar20);
  auVar34._8_8_ = dVar8;
  auVar34._0_8_ = dVar8;
  auVar34 = maxpd(auVar33,auVar34);
  dVar26 = p1[1] - dVar4;
  auVar28._0_8_ = ABS(q0[1] - dVar4);
  auVar28._8_8_ = ABS(dVar26);
  auVar34 = maxpd(auVar28,auVar34);
  dVar32 = p1[3] - dVar22;
  dVar31 = p1[4] - dVar1;
  dVar30 = p1[5] - dVar2;
  dVar29 = p1[6] - dVar6;
  auVar9._0_8_ = ABS(q0[2] - dVar15);
  auVar9._8_8_ = ABS(dVar23);
  auVar34 = maxpd(auVar9,auVar34);
  auVar16._0_8_ = ABS(q0[3] - dVar22);
  auVar16._8_8_ = ABS(dVar32);
  auVar34 = maxpd(auVar16,auVar34);
  auVar10._0_8_ = ABS(q0[4] - dVar1);
  auVar10._8_8_ = ABS(dVar31);
  auVar34 = maxpd(auVar10,auVar34);
  auVar17._0_8_ = ABS(q0[5] - dVar2);
  auVar17._8_8_ = ABS(dVar30);
  auVar34 = maxpd(auVar17,auVar34);
  auVar12._0_8_ = ABS(q0[6] - dVar6);
  auVar12._8_8_ = ABS(dVar29);
  auVar34 = maxpd(auVar12,auVar34);
  dVar11 = auVar34._0_8_;
  dVar13 = auVar34._8_8_;
  dVar14 = dVar13;
  dVar8 = dVar11;
  if ((dVar13 <= dVar11) && (dVar8 = dVar13, dVar13 < dVar11)) {
    dVar14 = dVar11;
  }
  iVar5 = 0;
  if ((1.2708086158026695e-147 <= dVar8) && (dVar14 <= 5.599361855444509e+101)) {
    dVar15 = dVar29 * (q0[6] - dVar6) +
             dVar30 * (q0[5] - dVar2) +
             dVar31 * (q0[4] - dVar1) +
             dVar32 * (q0[3] - dVar22) +
             dVar23 * (q0[2] - dVar15) + dVar20 * (*q0 - dVar3) + dVar26 * (q0[1] - dVar4);
    dVar15 = (dVar7 * dVar7 +
             dVar27 * dVar27 +
             dVar18 * dVar18 + dVar19 * dVar19 + dVar21 * dVar21 + dVar24 * dVar24 + dVar25 * dVar25
             ) - (dVar15 + dVar15);
    dVar22 = dVar13 * dVar11 * 1.3777934958250494e-14;
    if (dVar22 < dVar15) {
      return 1;
    }
    if (dVar15 < -dVar22) {
      iVar5 = -1;
    }
  }
  return iVar5;
}

Assistant:

inline int side1_7d_filter( const double* p0, const double* p1, const double* q0) {
    double p0_0_p1_0 = (p0[0] - p1[0]);
    double p0_1_p1_1 = (p0[1] - p1[1]);
    double p0_2_p1_2 = (p0[2] - p1[2]);
    double p0_3_p1_3 = (p0[3] - p1[3]);
    double p0_4_p1_4 = (p0[4] - p1[4]);
    double p0_5_p1_5 = (p0[5] - p1[5]);
    double p0_6_p1_6 = (p0[6] - p1[6]);
    double r;
    r = (1 * (((((((p0_0_p1_0 * p0_0_p1_0) + (p0_1_p1_1 * p0_1_p1_1)) + (p0_2_p1_2 * p0_2_p1_2)) + (p0_3_p1_3 * p0_3_p1_3)) + (p0_4_p1_4 * p0_4_p1_4)) + (p0_5_p1_5 * p0_5_p1_5)) + (p0_6_p1_6 * p0_6_p1_6)));
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double p1_4_p0_4 = (p1[4] - p0[4]);
    double q0_4_p0_4 = (q0[4] - p0[4]);
    double p1_5_p0_5 = (p1[5] - p0[5]);
    double q0_5_p0_5 = (q0[5] - p0[5]);
    double p1_6_p0_6 = (p1[6] - p0[6]);
    double q0_6_p0_6 = (q0[6] - p0[6]);
    r = (r - (2 * (((((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)) + (p1_4_p0_4 * q0_4_p0_4)) + (p1_5_p0_5 * q0_5_p0_5)) + (p1_6_p0_6 * q0_6_p0_6))));
    int int_tmp_result;
    double eps;
    double max1 = fabs(p0_0_p1_0);
    if( (max1 < fabs(p0_1_p1_1)) )
    {
        max1 = fabs(p0_1_p1_1);
    } 
    if( (max1 < fabs(p0_2_p1_2)) )
    {
        max1 = fabs(p0_2_p1_2);
    } 
    if( (max1 < fabs(p0_3_p1_3)) )
    {
        max1 = fabs(p0_3_p1_3);
    } 
    if( (max1 < fabs(p0_4_p1_4)) )
    {
        max1 = fabs(p0_4_p1_4);
    } 
    if( (max1 < fabs(p0_5_p1_5)) )
    {
        max1 = fabs(p0_5_p1_5);
    } 
    if( (max1 < fabs(p0_6_p1_6)) )
    {
        max1 = fabs(p0_6_p1_6);
    } 
    if( (max1 < fabs(p1_0_p0_0)) )
    {
        max1 = fabs(p1_0_p0_0);
    } 
    if( (max1 < fabs(p1_1_p0_1)) )
    {
        max1 = fabs(p1_1_p0_1);
    } 
    if( (max1 < fabs(p1_2_p0_2)) )
    {
        max1 = fabs(p1_2_p0_2);
    } 
    if( (max1 < fabs(p1_3_p0_3)) )
    {
        max1 = fabs(p1_3_p0_3);
    } 
    if( (max1 < fabs(p1_4_p0_4)) )
    {
        max1 = fabs(p1_4_p0_4);
    } 
    if( (max1 < fabs(p1_5_p0_5)) )
    {
        max1 = fabs(p1_5_p0_5);
    } 
    if( (max1 < fabs(p1_6_p0_6)) )
    {
        max1 = fabs(p1_6_p0_6);
    } 
    double max2 = fabs(p0_0_p1_0);
    if( (max2 < fabs(p0_1_p1_1)) )
    {
        max2 = fabs(p0_1_p1_1);
    } 
    if( (max2 < fabs(p0_2_p1_2)) )
    {
        max2 = fabs(p0_2_p1_2);
    } 
    if( (max2 < fabs(p0_3_p1_3)) )
    {
        max2 = fabs(p0_3_p1_3);
    } 
    if( (max2 < fabs(p0_4_p1_4)) )
    {
        max2 = fabs(p0_4_p1_4);
    } 
    if( (max2 < fabs(p0_5_p1_5)) )
    {
        max2 = fabs(p0_5_p1_5);
    } 
    if( (max2 < fabs(p0_6_p1_6)) )
    {
        max2 = fabs(p0_6_p1_6);
    } 
    if( (max2 < fabs(q0_0_p0_0)) )
    {
        max2 = fabs(q0_0_p0_0);
    } 
    if( (max2 < fabs(q0_1_p0_1)) )
    {
        max2 = fabs(q0_1_p0_1);
    } 
    if( (max2 < fabs(q0_2_p0_2)) )
    {
        max2 = fabs(q0_2_p0_2);
    } 
    if( (max2 < fabs(q0_3_p0_3)) )
    {
        max2 = fabs(q0_3_p0_3);
    } 
    if( (max2 < fabs(q0_4_p0_4)) )
    {
        max2 = fabs(q0_4_p0_4);
    } 
    if( (max2 < fabs(q0_5_p0_5)) )
    {
        max2 = fabs(q0_5_p0_5);
    } 
    if( (max2 < fabs(q0_6_p0_6)) )
    {
        max2 = fabs(q0_6_p0_6);
    } 
    double lower_bound_1;
    double upper_bound_1;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    else 
    {
        if( (max2 > upper_bound_1) )
        {
            upper_bound_1 = max2;
        } 
    } 
    if( (lower_bound_1 < 1.27080861580266953580e-147) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 5.59936185544450928309e+101) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (1.37779349582504943796e-14 * (max1 * max2));
        if( (r > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    return int_tmp_result;
}